

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::Geobucket
          (Geobucket<2UL> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  MOGrevlex<8UL> *oRight;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_RSI;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_RDI;
  Geobucket<2UL> *unaff_retaddr;
  size_type in_stack_ffffffffffffffd8;
  vector<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  *in_stack_ffffffffffffffe0;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight_00;
  
  polyRight_00 = in_RDI;
  std::
  vector<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
  vector((vector<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          *)0x1d0825);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1d0838);
  std::
  vector<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
  resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  oRight = (MOGrevlex<8UL> *)
           std::
           vector<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ::operator[]((vector<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                         *)in_RDI,0);
  GetOrder(in_RSI);
  SetOrder(in_RDI,oRight);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
             (value_type_conflict1 *)oRight);
  SymDiffSplice(unaff_retaddr,polyRight_00);
  return;
}

Assistant:

Geobucket(MP& polyRight)
		{
			_buckets.resize(1);
			_buckets[0].SetOrder(polyRight.GetOrder());
			_maxsizes.push_back(_d);
			SymDiffSplice(polyRight);
		}